

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multitexturedmesh.h
# Opt level: O0

void __thiscall
gvr::MultiTextureCoordReceiver::setValue
          (MultiTextureCoordReceiver *this,int instance,PLYValue *value)

{
  MultiTexturedMesh *pMVar1;
  long *in_RDX;
  int in_ESI;
  long in_RDI;
  float fVar2;
  
  pMVar1 = *(MultiTexturedMesh **)(in_RDI + 8);
  fVar2 = (float)(**(code **)(*in_RDX + 0x30))(in_RDX,0);
  MultiTexturedMesh::setTextureCoordComp(pMVar1,in_ESI,0,0,fVar2);
  pMVar1 = *(MultiTexturedMesh **)(in_RDI + 8);
  fVar2 = (float)(**(code **)(*in_RDX + 0x30))(in_RDX,1);
  MultiTexturedMesh::setTextureCoordComp(pMVar1,in_ESI,0,1,fVar2);
  pMVar1 = *(MultiTexturedMesh **)(in_RDI + 8);
  fVar2 = (float)(**(code **)(*in_RDX + 0x30))(in_RDX,2);
  MultiTexturedMesh::setTextureCoordComp(pMVar1,in_ESI,1,0,fVar2);
  pMVar1 = *(MultiTexturedMesh **)(in_RDI + 8);
  fVar2 = (float)(**(code **)(*in_RDX + 0x30))(in_RDX,3);
  MultiTexturedMesh::setTextureCoordComp(pMVar1,in_ESI,1,1,fVar2);
  pMVar1 = *(MultiTexturedMesh **)(in_RDI + 8);
  fVar2 = (float)(**(code **)(*in_RDX + 0x30))(in_RDX,4);
  MultiTexturedMesh::setTextureCoordComp(pMVar1,in_ESI,2,0,fVar2);
  pMVar1 = *(MultiTexturedMesh **)(in_RDI + 8);
  fVar2 = (float)(**(code **)(*in_RDX + 0x30))(in_RDX,5);
  MultiTexturedMesh::setTextureCoordComp(pMVar1,in_ESI,2,1,fVar2);
  return;
}

Assistant:

void setValue(int instance, const PLYValue &value)
    {
      p.setTextureCoordComp(instance, 0, 0, value.getFloat(0));
      p.setTextureCoordComp(instance, 0, 1, value.getFloat(1));
      p.setTextureCoordComp(instance, 1, 0, value.getFloat(2));
      p.setTextureCoordComp(instance, 1, 1, value.getFloat(3));
      p.setTextureCoordComp(instance, 2, 0, value.getFloat(4));
      p.setTextureCoordComp(instance, 2, 1, value.getFloat(5));
    }